

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

bool __thiscall
slang::IntervalMap<unsigned_long,std::monostate,0u>::iterator::
overflow<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  long lVar1;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
  *this_00;
  int iVar2;
  bool bVar3;
  int iVar4;
  uintptr_t intWord;
  NodeRef NVar5;
  NodeRef NVar6;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *pLVar7;
  IndexPair IVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t uVar13;
  iterator *this_01;
  uint uVar14;
  uint32_t uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> **ppLVar19;
  uint32_t uVar20;
  ulong uVar21;
  uint32_t *puVar22;
  uint32_t local_cc;
  uint32_t curSizes [4];
  uint32_t newSizes [4];
  ulong local_98;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *nodes [4];
  interval<unsigned_long> ival;
  
  this_01 = this + 8;
  lVar17 = (ulong)level * 0x10;
  uVar20 = *(uint32_t *)(*(long *)(this + 8) + 0xc + lVar17);
  NVar5 = IntervalMapDetails::Path::getLeftSibling((Path *)this_01,level);
  if (NVar5.pip.value == 0) {
    uVar15 = 0;
  }
  else {
    uVar9 = (uint)NVar5.pip.value & 0x3f;
    uVar15 = uVar9 + 1;
    uVar20 = uVar20 + uVar9 + 1;
    nodes[0] = (LeafNode<unsigned_long,_std::monostate,_11U,_false> *)
               ((ulong)NVar5.pip.value & 0xffffffffffffffc0);
    curSizes[0] = uVar15;
  }
  bVar3 = NVar5.pip.value != 0;
  lVar1 = *(long *)this_01;
  uVar13 = *(uint32_t *)(lVar1 + 8 + lVar17);
  curSizes[bVar3] = uVar13;
  uVar15 = uVar15 + uVar13;
  uVar18 = (ulong)(bVar3 + 1);
  nodes[bVar3] = *(LeafNode<unsigned_long,_std::monostate,_11U,_false> **)(lVar1 + lVar17);
  NVar6 = IntervalMapDetails::Path::getRightSibling((Path *)this_01,level);
  if (NVar6.pip.value != 0) {
    uVar9 = (uint)NVar6.pip.value & 0x3f;
    curSizes[uVar18] = uVar9 + 1;
    uVar15 = uVar15 + uVar9 + 1;
    nodes[uVar18] =
         (LeafNode<unsigned_long,_std::monostate,_11U,_false> *)
         ((ulong)NVar6.pip.value & 0xffffffffffffffc0);
    uVar18 = (ulong)(bVar3 | 2);
  }
  iVar10 = (int)uVar18;
  local_98 = 0;
  if ((uint)(iVar10 * 0xb) < uVar15 + 1) {
    local_98 = (ulong)(iVar10 - 1);
    if (iVar10 == 1) {
      local_98 = uVar18;
    }
    curSizes[uVar18] = curSizes[local_98];
    nodes[uVar18] = nodes[local_98];
    curSizes[local_98] = 0;
    pLVar7 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)alloc);
    nodes[local_98] = pLVar7;
    uVar18 = (ulong)(iVar10 + 1);
  }
  uVar13 = (uint32_t)uVar18;
  IVar8 = IntervalMapDetails::distribute(uVar13,uVar15,0xb,newSizes,uVar20);
  uVar21 = (ulong)(uVar13 - 1);
  iVar10 = uVar13 - 2;
  uVar16 = uVar21;
  do {
    if (uVar16 == 0) {
      ppLVar19 = nodes;
      puVar22 = curSizes;
      uVar11 = 0;
      uVar16 = uVar21;
      do {
        puVar22 = puVar22 + 1;
        ppLVar19 = ppLVar19 + 1;
        if (uVar11 == uVar21) {
          if (NVar5.pip.value != 0) {
            IntervalMapDetails::Path::moveLeft((Path *)this_01,level);
          }
          uVar16 = 0;
          bVar3 = false;
          local_cc = level;
          while( true ) {
            if (local_98 == uVar16 && (int)local_98 != 0) {
              this_00 = (NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
                         *)nodes[local_98];
              ival = IntervalMapDetails::
                     NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
                     ::getBounds(this_00,newSizes[local_98]);
              bVar3 = IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::insertNode
                                ((iterator *)this,local_cc,
                                 (NodeRef)((ulong)this_00 & 0xffffffffffffffc0 |
                                          (ulong)(newSizes[local_98] - 1)),&ival,alloc);
              local_cc = local_cc + bVar3;
            }
            else {
              IntervalMapDetails::Path::setSize((Path *)this_01,local_cc,newSizes[uVar16]);
              IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::recomputeBounds
                        ((iterator *)this,local_cc);
            }
            if (uVar18 - 1 == uVar16) break;
            IntervalMapDetails::Path::moveRight((Path *)this_01,local_cc);
            uVar16 = uVar16 + 1;
          }
          for (iVar10 = IVar8.first - (int)uVar16; iVar10 != 0; iVar10 = iVar10 + 1) {
            IntervalMapDetails::Path::moveLeft((Path *)this_01,local_cc);
          }
          *(uint *)(*(long *)this_01 + 0xc + (ulong)local_cc * 0x10) = IVar8.second;
          return bVar3;
        }
        uVar9 = curSizes[uVar11];
        uVar14 = newSizes[uVar11];
        if (uVar9 != uVar14) {
          uVar12 = 0;
          do {
            if (uVar16 == uVar12) break;
            uVar20 = puVar22[uVar12];
            iVar10 = IntervalMapDetails::
                     NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
                     ::adjustFromLeftSib(&ppLVar19[uVar12]->
                                          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
                                         ,uVar20,&nodes[uVar11]->
                                                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
                                         ,uVar9,uVar9 - uVar14);
            puVar22[uVar12] = uVar20 + iVar10;
            uVar9 = curSizes[uVar11] - iVar10;
            curSizes[uVar11] = uVar9;
            uVar14 = newSizes[uVar11];
            uVar12 = uVar12 + 1;
          } while (uVar9 < uVar14);
        }
        uVar11 = uVar11 + 1;
        uVar16 = uVar16 - 1;
      } while( true );
    }
    uVar9 = curSizes[uVar16];
    uVar14 = newSizes[uVar16];
    iVar2 = iVar10;
    if (uVar9 != uVar14) {
      do {
        if (iVar2 == -1) break;
        uVar20 = curSizes[iVar2];
        iVar4 = IntervalMapDetails::
                NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>::
                adjustFromLeftSib(&nodes[uVar16]->
                                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
                                  ,uVar9,&nodes[iVar2]->
                                          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
                                  ,uVar20,uVar14 - uVar9);
        curSizes[iVar2] = uVar20 - iVar4;
        uVar9 = iVar4 + curSizes[uVar16];
        curSizes[uVar16] = uVar9;
        uVar14 = newSizes[uVar16];
        iVar2 = iVar2 + -1;
      } while (uVar9 < uVar14);
    }
    iVar10 = iVar10 + -1;
    uVar16 = uVar16 - 1;
  } while( true );
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::overflow(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    using namespace IntervalMapDetails;

    auto& path = this->path;
    uint32_t offset = path.offset(level);
    uint32_t numElems = 0;
    uint32_t numNodes = 0;
    TNode* nodes[4];
    uint32_t curSizes[4];

    // Handle left sibling, if it exists.
    NodeRef leftSib = path.getLeftSibling(level);
    if (leftSib) {
        numElems = curSizes[0] = leftSib.size();
        offset += numElems;
        nodes[numNodes++] = &leftSib.get<TNode>();
    }

    // Handle the current node.
    numElems += curSizes[numNodes] = path.size(level);
    nodes[numNodes++] = &path.template node<TNode>(level);

    // Handle right sibling, if it exists.
    NodeRef rightSib = path.getRightSibling(level);
    if (rightSib) {
        numElems += curSizes[numNodes] = rightSib.size();
        nodes[numNodes++] = &rightSib.get<TNode>();
    }

    // Check if we need to allocate a new node.
    uint32_t newNode = 0;
    if (numElems + 1 > numNodes * TNode::Capacity) {
        // Insert new node at the penultimate position, or after a single node if only one.
        newNode = numNodes == 1 ? 1 : numNodes - 1;
        curSizes[numNodes] = curSizes[newNode];
        nodes[numNodes] = nodes[newNode];
        curSizes[newNode] = 0;
        nodes[newNode] = alloc.template emplace<TNode>();
        numNodes++;
    }

    // Redistribute elements among the nodes.
    uint32_t newSizes[4];
    IndexPair newOffset = distribute(numNodes, numElems, TNode::Capacity, newSizes, offset);

    // Move elements right.
    for (uint32_t n = numNodes - 1; n; --n) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (int m = int(n - 1); m != -1; --m) {
            int delta = nodes[n]->adjustFromLeftSib(curSizes[n], *nodes[m], curSizes[m],
                                                    int(newSizes[n]) - int(curSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) - delta);
            curSizes[n] = uint32_t(int(curSizes[n]) + delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move elements left.
    for (uint32_t n = 0; n < numNodes - 1; n++) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (uint32_t m = n + 1; m < numNodes; m++) {
            int delta = nodes[m]->adjustFromLeftSib(curSizes[m], *nodes[n], curSizes[n],
                                                    int(curSizes[n]) - int(newSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) + delta);
            curSizes[n] = uint32_t(int(curSizes[n]) - delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move the path to the leftmost node.
    if (leftSib)
        path.moveLeft(level);

    // Elements have been moved, update node sizes and interval bounds.
    bool split = false;
    uint32_t pos = 0;
    while (true) {
        if (newNode && pos == newNode) {
            // Actually insert the new node that we created earlier.
            auto ival = nodes[pos]->getBounds(newSizes[pos]);
            split = insertNode(level, NodeRef(nodes[pos], newSizes[pos]), ival, alloc);
            if (split)
                level++;
        }
        else {
            // Otherwise just update the size and bounds.
            path.setSize(level, newSizes[pos]);
            recomputeBounds(level);
        }

        if (pos + 1 == numNodes)
            break;

        path.moveRight(level);
        ++pos;
    }

    // Move our path to the new offset of the element we used to be pointing at.
    while (pos != newOffset.first) {
        path.moveLeft(level);
        --pos;
    }

    path.offset(level) = newOffset.second;
    return split;
}